

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertiesReader.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
aeron::archive::util::PropertiesReader::parseLine
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,PropertiesReader *this,string *line)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  byte *pbVar1;
  size_type sVar2;
  pointer pcVar3;
  long *plVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  runtime_error *this_00;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  size_type sVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  byte *pbVar15;
  byte *pbVar16;
  bool bVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  ulong local_50;
  string *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  paVar14 = &(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar14;
  uVar11 = 0;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  local_38 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)local_38;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  sVar2 = line->_M_string_length;
  if (sVar2 == 0) {
    bVar17 = true;
    uVar9 = 0;
    uVar8 = 0;
    iVar7 = 0;
  }
  else {
    pcVar3 = (line->_M_dataplus)._M_p;
    sVar13 = 0;
    iVar7 = 0;
    local_50 = 0;
    uVar9 = 0;
    uVar11 = 0;
    local_48 = line;
    local_40 = paVar14;
    do {
      uVar10 = (uint)(byte)pcVar3[sVar13];
      if (iVar7 == 1) {
        iVar7 = 1;
        if (uVar10 != 0x23) {
          if (uVar10 == 0x3d) {
            ::std::__cxx11::string::string((string *)&local_70,(string *)local_48,uVar9,uVar11);
            ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            anon_unknown.dwarf_e297e::rtrim(&__return_storage_ptr__->first);
            uVar9 = uVar11 + 1;
            iVar7 = 2;
          }
          goto LAB_0013d40a;
        }
        iVar6 = 2;
        bVar17 = false;
      }
      else {
        if (iVar7 == 0) {
          iVar6 = isspace(uVar10);
          iVar7 = 0;
          if (iVar6 == 0) {
            iVar6 = 1;
            if (uVar10 == 0x23) {
              bVar17 = false;
              local_50 = 1;
              iVar7 = 0;
              goto LAB_0013d411;
            }
            iVar7 = 1;
            uVar9 = uVar11;
          }
        }
        else {
          iVar6 = 2;
          if (uVar10 == 0x23) {
            bVar17 = false;
            iVar7 = 2;
            goto LAB_0013d411;
          }
          iVar7 = 2;
        }
LAB_0013d40a:
        uVar11 = uVar11 + 1;
        iVar6 = 0;
        bVar17 = true;
      }
LAB_0013d411:
      if (!bVar17) goto LAB_0013d426;
      sVar13 = sVar13 + 1;
    } while (sVar2 != sVar13);
    iVar6 = 2;
LAB_0013d426:
    bVar17 = iVar6 == 2;
    uVar8 = local_50;
    paVar14 = local_40;
    line = local_48;
  }
  s = &__return_storage_ptr__->second;
  if (!bVar17) {
    if ((uVar8 & 1) != 0) {
      return __return_storage_ptr__;
    }
    plVar4 = (long *)(s->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar4 != local_38) {
      operator_delete(plVar4,local_38->_M_allocated_capacity + 1);
    }
    plVar4 = (long *)(__return_storage_ptr__->first)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar4 == paVar14) {
      return __return_storage_ptr__;
    }
    operator_delete(plVar4,paVar14->_M_allocated_capacity + 1);
    return __return_storage_ptr__;
  }
  if (iVar7 != 2) {
    if (iVar7 != 1) {
      return __return_storage_ptr__;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_70,"no value: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)line);
    ::std::runtime_error::runtime_error(this_00,(string *)&local_70);
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::string((string *)&local_70,(string *)line,uVar9,uVar11);
  ::std::__cxx11::string::operator=((string *)s,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pbVar5 = (byte *)(__return_storage_ptr__->second)._M_dataplus._M_p;
  uVar11 = (__return_storage_ptr__->second)._M_string_length;
  pbVar1 = pbVar5 + uVar11;
  pbVar15 = pbVar5;
  if (0 < (long)uVar11 >> 2) {
    pbVar15 = pbVar5 + (uVar11 & 0xfffffffffffffffc);
    lVar12 = ((long)uVar11 >> 2) + 1;
    pbVar16 = pbVar5 + 3;
    do {
      iVar7 = isspace((uint)pbVar16[-3]);
      if (iVar7 == 0) {
        pbVar16 = pbVar16 + -3;
        goto LAB_0013d609;
      }
      iVar7 = isspace((uint)pbVar16[-2]);
      if (iVar7 == 0) {
        pbVar16 = pbVar16 + -2;
        goto LAB_0013d609;
      }
      iVar7 = isspace((uint)pbVar16[-1]);
      if (iVar7 == 0) {
        pbVar16 = pbVar16 + -1;
        goto LAB_0013d609;
      }
      iVar7 = isspace((uint)*pbVar16);
      if (iVar7 == 0) goto LAB_0013d609;
      lVar12 = lVar12 + -1;
      pbVar16 = pbVar16 + 4;
    } while (1 < lVar12);
  }
  lVar12 = (long)pbVar1 - (long)pbVar15;
  if (lVar12 != 1) {
    if (lVar12 != 2) {
      pbVar16 = pbVar1;
      if ((lVar12 != 3) || (iVar7 = isspace((uint)*pbVar15), pbVar16 = pbVar15, iVar7 == 0))
      goto LAB_0013d609;
      pbVar15 = pbVar15 + 1;
    }
    iVar7 = isspace((uint)*pbVar15);
    pbVar16 = pbVar15;
    if (iVar7 == 0) goto LAB_0013d609;
    pbVar15 = pbVar15 + 1;
  }
  iVar7 = isspace((uint)*pbVar15);
  pbVar16 = pbVar15;
  if (iVar7 != 0) {
    pbVar16 = pbVar1;
  }
LAB_0013d609:
  if (pbVar1 == pbVar16) {
    (__return_storage_ptr__->second)._M_string_length = 0;
    *pbVar5 = 0;
  }
  else {
    ::std::__cxx11::string::_M_erase((ulong)s,0);
  }
  anon_unknown.dwarf_e297e::rtrim(s);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> PropertiesReader::parseLine(const std::string& line) {
    enum { START, KEY, VALUE } state;
    state = START;

    std::pair<std::string, std::string> result;

    std::size_t i = 0, pos = 0;
    for (char c : line) {
        if (state == START) {
            if (!std::isspace((unsigned char)c)) {
                if (c == '#') {
                    return result;
                } else {
                    state = KEY;
                    pos = i;
                }
            }
        } else if (state == KEY) {
            if (c == '=') {
                state = VALUE;
                result.first = std::string(line, pos, i);
                rtrim(result.first);
                pos = i + 1;
            } else if (c == '#') {
                break;
            }
        } else if (state == VALUE) {
            if (c == '#') {
                break;
            }
        } else {
            throw std::runtime_error("unknown state: " + std::to_string(state));
        }
        ++i;
    }

    if (state == KEY) {
        throw std::runtime_error("no value: " + line);
    } else if (state == VALUE) {
        result.second = std::string(line, pos, i);
        trim(result.second);
    }

    return result;
}